

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

optional<wallet::MigrationData> * __thiscall
wallet::CWallet::GetDescriptorsForLegacy
          (optional<wallet::MigrationData> *__return_storage_ptr__,CWallet *this,
          bilingual_str *error)

{
  string_view func;
  undefined8 uVar1;
  undefined8 uVar2;
  LegacyDataSPKM *this_00;
  long in_FS_OFFSET;
  string_view msg;
  string_view file;
  optional<wallet::MigrationData> res;
  char *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [4];
  undefined8 uStack_68;
  bool local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = GetLegacyDataSPKM(this);
  if (this_00 == (LegacyDataSPKM *)0x0) {
    func._M_str = "GetDescriptorsForLegacy";
    func._M_len = 0x17;
    msg._M_str = "Error: Legacy wallet data missing";
    msg._M_len = 0x21;
    file._M_str = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp";
    file._M_len = 0x5a;
    StrFormatInternalBug_abi_cxx11_(&local_58,msg,file,0xfc6,func);
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_108,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    local_e8[0]._M_dataplus._M_p = (pointer)&local_e8[0].field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8[0]._M_dataplus._M_p != &local_e8[0].field_2) {
      operator_delete(local_e8[0]._M_dataplus._M_p,
                      CONCAT71(local_e8[0].field_2._M_allocated_capacity._1_7_,
                               local_e8[0].field_2._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload.
    super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
    super__Optional_payload_base<wallet::MigrationData>._M_engaged = false;
  }
  else {
    LegacyDataSPKM::MigrateToDescriptor((optional<wallet::MigrationData> *)local_108,this_00);
    uVar2 = uStack_68;
    uVar1 = local_e8[3].field_2._0_8_;
    if (local_60 == false) {
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,
                 "Error: Unable to produce descriptors for this legacy wallet. Make sure to provide the wallet\'s passphrase if it is encrypted."
                 ,"");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,
                   "Error: Unable to produce descriptors for this legacy wallet. Make sure to provide the wallet\'s passphrase if it is encrypted."
                   ,"");
      }
      else {
        local_150 = 
        "Error: Unable to produce descriptors for this legacy wallet. Make sure to provide the wallet\'s passphrase if it is encrypted."
        ;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_128,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_150);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,&local_148);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_engaged = false;
    }
    else {
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_engaged = false;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>).
        _M_payload.super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
        super__Optional_payload_base<wallet::MigrationData>._M_payload = local_108._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>).
               _M_payload.super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
               super__Optional_payload_base<wallet::MigrationData>._M_payload + 8) = local_108._8_8_
      ;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>).
               _M_payload.super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
               super__Optional_payload_base<wallet::MigrationData>._M_payload + 0x10) =
           local_108._16_8_;
      *(ulong *)((long)&(__return_storage_ptr__->
                        super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload.
                        super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
                        super__Optional_payload_base<wallet::MigrationData>._M_payload + 0x18) =
           CONCAT44(local_108._28_4_,local_108._24_4_);
      *(ulong *)((long)&(__return_storage_ptr__->
                        super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload.
                        super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
                        super__Optional_payload_base<wallet::MigrationData>._M_payload + 0x1c) =
           CONCAT44(local_e8[0]._M_dataplus._M_p._0_4_,local_108._28_4_);
      *(ulong *)((long)&(__return_storage_ptr__->
                        super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload.
                        super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
                        super__Optional_payload_base<wallet::MigrationData>._M_payload + 0x24) =
           CONCAT44((undefined4)local_e8[0]._M_string_length,local_e8[0]._M_dataplus._M_p._4_4_);
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.master_key.key.
      fCompressed = (bool)local_e8[0].field_2._0_1_;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.master_key.key.keydata
      ._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
           (array<unsigned_char,_32UL> *)local_e8[0].field_2._8_8_;
      local_e8[0].field_2._8_8_ =
           (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
            )0x0;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.watch_descs.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_e8[1]._M_dataplus._M_p;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.watch_descs.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_e8[1]._M_string_length;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.watch_descs.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_e8[1].field_2._0_8_;
      local_e8[1].field_2._0_8_ = (pointer)0x0;
      local_e8[1]._M_dataplus._M_p = (pointer)0x0;
      local_e8[1]._M_string_length = 0;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.solvable_descs.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_e8[1].field_2._8_8_;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.solvable_descs.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_e8[2]._M_dataplus._M_p;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.solvable_descs.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_e8[2]._M_string_length;
      local_e8[2]._M_string_length = 0;
      local_e8[1].field_2._8_8_ = (pointer)0x0;
      local_e8[2]._M_dataplus._M_p = (pointer)0x0;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.desc_spkms.
      super__Vector_base<std::unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>,_std::allocator<std::unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_e8[2].field_2._0_8_;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.desc_spkms.
      super__Vector_base<std::unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>,_std::allocator<std::unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_e8[2].field_2._8_8_;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.desc_spkms.
      super__Vector_base<std::unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>,_std::allocator<std::unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_e8[3]._M_dataplus._M_p;
      local_e8[3]._M_dataplus._M_p = (pointer)0x0;
      local_e8[2].field_2._0_8_ = (pointer)0x0;
      local_e8[2].field_2._8_8_ = (pointer)0x0;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.watchonly_wallet.
      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_e8[3].field_2._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.watchonly_wallet.
      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_e8[3]._M_string_length;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.watchonly_wallet.
      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
      local_e8[3]._M_string_length = 0;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.solvable_wallet.
      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      uStack_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.solvable_wallet.
      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_e8[3].field_2._8_8_;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_payload._M_value.solvable_wallet.
      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
      local_e8[3].field_2._8_8_ = (element_type *)0x0;
      (__return_storage_ptr__->super__Optional_base<wallet::MigrationData,_false,_false>)._M_payload
      .super__Optional_payload<wallet::MigrationData,_true,_false,_false>.
      super__Optional_payload_base<wallet::MigrationData>._M_engaged = true;
    }
    if (local_60 == true) {
      std::_Optional_payload_base<wallet::MigrationData>::_M_destroy
                ((_Optional_payload_base<wallet::MigrationData> *)local_108);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<MigrationData> CWallet::GetDescriptorsForLegacy(bilingual_str& error) const
{
    AssertLockHeld(cs_wallet);

    LegacyDataSPKM* legacy_spkm = GetLegacyDataSPKM();
    if (!Assume(legacy_spkm)) {
        // This shouldn't happen
        error = Untranslated(STR_INTERNAL_BUG("Error: Legacy wallet data missing"));
        return std::nullopt;
    }

    std::optional<MigrationData> res = legacy_spkm->MigrateToDescriptor();
    if (res == std::nullopt) {
        error = _("Error: Unable to produce descriptors for this legacy wallet. Make sure to provide the wallet's passphrase if it is encrypted.");
        return std::nullopt;
    }
    return res;
}